

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

bool bssl::ssl_get_new_session(SSL_HANDSHAKE *hs)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  int iVar5;
  pointer psVar6;
  pointer psVar7;
  pointer pCVar8;
  OPENSSL_timeval OVar9;
  Span<const_unsigned_char> local_68;
  uint16_t local_52;
  uint64_t uStack_50;
  uint16_t version;
  OPENSSL_timeval now;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_28;
  UniquePtr<SSL_SESSION> session;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)hs->ssl;
  if ((*(uint32_t *)
        ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x84) & 0x200) == 0) {
    psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                       ((UniquePtr<SSL_CTX> *)
                        ((long)session._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x68));
    ssl_session_new((bssl *)&local_28,psVar6->x509_method);
    bVar4 = std::operator==(&local_28,(nullptr_t)0x0);
    if (bVar4) {
      hs_local._7_1_ = false;
    }
    else {
      bVar1 = *(byte *)((long)session._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0xa4);
      psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      psVar7->field_0x1b8 = psVar7->field_0x1b8 & 0xef | (bVar1 & 1) << 4;
      uVar2 = *(uint16_t *)
               (*(long *)((long)session._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x30)
               + 0xd0);
      psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      psVar7->ssl_version = uVar2;
      iVar5 = SSL_is_quic((SSL *)session._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      psVar7->field_0x1b8 = psVar7->field_0x1b8 & 0xdf | (iVar5 != 0) << 5;
      psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                          ((long)session._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x68)
                         );
      OVar9 = ssl_ctx_get_current_time(psVar6);
      now.tv_sec._0_4_ = OVar9.tv_usec;
      uStack_50 = OVar9.tv_sec;
      psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      psVar7->time = OVar9.tv_sec;
      local_52 = ssl_protocol_version
                           ((SSL *)session._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      if (local_52 < 0x304) {
        psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                            ((long)session._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                            0x70));
        uVar3 = psVar6->session_timeout;
        psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        psVar7->timeout = uVar3;
        psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                            ((long)session._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                            0x70));
        uVar3 = psVar6->session_timeout;
        psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        psVar7->auth_timeout = uVar3;
      }
      else {
        psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                            ((long)session._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                            0x70));
        uVar3 = psVar6->session_psk_dhe_timeout;
        psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        psVar7->timeout = uVar3;
        psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        psVar7->auth_timeout = 0x93a80;
      }
      psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      pCVar8 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&hs->config->cert);
      Span<unsigned_char_const>::
      Span<bssl::InplaceVector<unsigned_char,32ul>,void,bssl::InplaceVector<unsigned_char,32ul>>
                ((Span<unsigned_char_const> *)&local_68,&pCVar8->sid_ctx);
      bVar4 = InplaceVector<unsigned_char,_32UL>::TryCopyFrom(&psVar7->sid_ctx,local_68);
      if (bVar4) {
        psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        psVar7->field_0x1b8 = psVar7->field_0x1b8 | 4;
        psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        psVar7->verify_result = 0x41;
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                  (&hs->new_session,&local_28);
        ssl_set_session((SSL *)session._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                        (SSL_SESSION *)0x0);
        hs_local._7_1_ = true;
      }
      else {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                      ,0xfc);
        hs_local._7_1_ = false;
      }
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  }
  else {
    ERR_put_error(0x10,0,0xd1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                  ,0xdd);
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_get_new_session(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (ssl->mode & SSL_MODE_NO_SESSION_CREATION) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SESSION_MAY_NOT_BE_CREATED);
    return false;
  }

  UniquePtr<SSL_SESSION> session = ssl_session_new(ssl->ctx->x509_method);
  if (session == NULL) {
    return false;
  }

  session->is_server = ssl->server;
  session->ssl_version = ssl->s3->version;
  session->is_quic = SSL_is_quic(ssl);

  // Fill in the time from the |SSL_CTX|'s clock.
  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
  session->time = now.tv_sec;

  uint16_t version = ssl_protocol_version(ssl);
  if (version >= TLS1_3_VERSION) {
    // TLS 1.3 uses tickets as authenticators, so we are willing to use them for
    // longer.
    session->timeout = ssl->session_ctx->session_psk_dhe_timeout;
    session->auth_timeout = SSL_DEFAULT_SESSION_AUTH_TIMEOUT;
  } else {
    // TLS 1.2 resumption does not incorporate new key material, so we use a
    // much shorter timeout.
    session->timeout = ssl->session_ctx->session_timeout;
    session->auth_timeout = ssl->session_ctx->session_timeout;
  }

  if (!session->sid_ctx.TryCopyFrom(hs->config->cert->sid_ctx)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // The session is marked not resumable until it is completely filled in.
  session->not_resumable = true;
  session->verify_result = X509_V_ERR_INVALID_CALL;

  hs->new_session = std::move(session);
  ssl_set_session(ssl, NULL);
  return true;
}